

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O2

GTree * g_tree_new_with_data(GCompareDataFunc key_compare_func,gpointer key_compare_data)

{
  GTree *pGVar1;
  
  pGVar1 = g_tree_new_full(key_compare_func,key_compare_data,(GDestroyNotify)0x0,(GDestroyNotify)0x0
                          );
  return pGVar1;
}

Assistant:

GTree *g_tree_new_with_data (GCompareDataFunc key_compare_func, gpointer key_compare_data)
{
    g_return_val_if_fail (key_compare_func != NULL, NULL);

    return g_tree_new_full (key_compare_func, key_compare_data, NULL, NULL);
}